

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept_mdapi.cpp
# Opt level: O0

void __thiscall CLIntercept::reportMDAPICounters(CLIntercept *this,ostream *os)

{
  bool bVar1;
  SConfig *pSVar2;
  pointer ppVar3;
  ostream *poVar4;
  pointer ppVar5;
  void *this_00;
  reference ppVar6;
  reference pvVar7;
  ostream *in_RSI;
  size_type __n;
  CLIntercept *in_RDI;
  SMetricAggregationData *aggregationData;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>
  *metric_1;
  const_iterator __end3;
  const_iterator __begin3;
  CMetricAggregationsForKernel *__range3;
  int numMetric;
  uint64_t count;
  CMetricAggregationsForKernel *kernelMetrics;
  string *kernelName;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>
  *metricsForKernel;
  iterator __end2_1;
  iterator __begin2_1;
  CMetricAggregations *__range2_1;
  string *metricName;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>
  *metric;
  iterator __end2;
  iterator __begin2;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>
  *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> headerWidths;
  string header;
  ostream *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  _Setw in_stack_fffffffffffffe64;
  ostream *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  _Self local_110;
  _Self local_108;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>
  *local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  _Base_ptr local_e8;
  uint64_t local_e0;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>
  *local_d8;
  reference local_d0;
  reference local_c8;
  _Self local_c0;
  _Self local_b8;
  CMetricAggregations *local_b0;
  undefined4 local_a8;
  string local_98 [32];
  reference local_78;
  reference local_70;
  _Self local_68;
  _Self local_60;
  _Base_ptr local_58;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>
  *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  pSVar2 = config(in_RDI);
  if ((pSVar2->DevicePerfCounterTiming & 1U) != 0) {
    pSVar2 = config(in_RDI);
    if ((pSVar2->DevicePerfCounterEventBasedSampling & 1U) != 0) {
      bVar1 = std::
              map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>_>
              ::empty((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>_>
                       *)0x27319e);
      if (!bVar1) {
        std::__cxx11::string::string(local_30);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2731c0);
        local_58 = (_Base_ptr)
                   std::
                   map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>_>
                   ::begin((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>_>
                            *)in_stack_fffffffffffffe58);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe64._M_n,in_stack_fffffffffffffe60))
        ;
        local_50 = &ppVar3->second;
        local_60._M_node =
             (_Base_ptr)
             std::
             map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>
             ::begin((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>
                      *)in_stack_fffffffffffffe58);
        local_68._M_node =
             (_Base_ptr)
             std::
             map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>
             ::end((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>
                    *)in_stack_fffffffffffffe58);
        while( true ) {
          bVar1 = std::operator!=(&local_60,&local_68);
          if (!bVar1) break;
          local_78 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>
                     ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>
                                  *)CONCAT44(in_stack_fffffffffffffe64._M_n,
                                             in_stack_fffffffffffffe60));
          local_70 = local_78;
          std::operator+(in_stack_fffffffffffffe88,
                         (char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          std::__cxx11::string::operator+=(local_30,local_98);
          std::__cxx11::string::~string(local_98);
          local_a8 = std::__cxx11::string::length();
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_fffffffffffffe64._M_n,in_stack_fffffffffffffe60),
                     (value_type_conflict3 *)in_stack_fffffffffffffe58);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>
                        *)CONCAT44(in_stack_fffffffffffffe64._M_n,in_stack_fffffffffffffe60));
        }
        poVar4 = (ostream *)
                 std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,
                                 "Device Performance Counter Timing: (Average metric per enqueue)");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(local_10,"                                FunctionName,  Calls, ");
        std::operator<<(poVar4,local_30);
        local_b0 = &in_RDI->m_MetricAggregations;
        local_b8._M_node =
             (_Base_ptr)
             std::
             map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>_>
             ::begin((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>_>
                      *)in_stack_fffffffffffffe58);
        local_c0._M_node =
             (_Base_ptr)
             std::
             map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>_>
             ::end((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>_>
                    *)in_stack_fffffffffffffe58);
        while( true ) {
          bVar1 = std::operator!=(&local_b8,&local_c0);
          if (!bVar1) break;
          local_d0 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>
                     ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>
                                  *)0x2733fc);
          local_d8 = &local_d0->second;
          local_c8 = local_d0;
          local_e8 = (_Base_ptr)
                     std::
                     map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>
                     ::begin((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>
                              *)in_stack_fffffffffffffe58);
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>
                   ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>
                                 *)CONCAT44(in_stack_fffffffffffffe64._M_n,in_stack_fffffffffffffe60
                                           ));
          local_e0 = (ppVar5->second).Count;
          this_00 = (void *)std::ostream::operator<<
                                      (local_10,std::endl<char,std::char_traits<char>>);
          poVar4 = (ostream *)std::ostream::operator<<(this_00,std::right);
          local_ec = (int)std::setw(0x2c);
          poVar4 = std::operator<<(poVar4,(_Setw)local_ec);
          poVar4 = std::operator<<(poVar4,(string *)local_d0);
          std::operator<<(poVar4,", ");
          poVar4 = (ostream *)std::ostream::operator<<(local_10,std::right);
          local_f0 = (int)std::setw(6);
          poVar4 = std::operator<<(poVar4,(_Setw)local_f0);
          in_stack_fffffffffffffe70 = (ostream *)std::ostream::operator<<(poVar4,local_e0);
          std::operator<<(in_stack_fffffffffffffe70,", ");
          local_f4 = 0;
          local_100 = local_d8;
          local_108._M_node =
               (_Base_ptr)
               std::
               map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>
               ::begin((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>
                        *)in_stack_fffffffffffffe58);
          local_110._M_node =
               (_Base_ptr)
               std::
               map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>
               ::end((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>
                      *)in_stack_fffffffffffffe58);
          while( true ) {
            bVar1 = std::operator!=(&local_108,&local_110);
            if (!bVar1) break;
            ppVar6 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>
                     ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>
                                  *)0x2735d2);
            poVar4 = (ostream *)std::ostream::operator<<(local_10,std::right);
            __n = (size_type)local_f4;
            local_f4 = local_f4 + 1;
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&local_48,__n);
            in_stack_fffffffffffffe64 = std::setw(*pvVar7);
            std::operator<<(poVar4,in_stack_fffffffffffffe64);
            in_stack_fffffffffffffe58 =
                 (ostream *)
                 std::ostream::operator<<(local_10,(ppVar6->second).Sum / (ppVar6->second).Count);
            std::operator<<(in_stack_fffffffffffffe58,", ");
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>
            ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>
                          *)CONCAT44(in_stack_fffffffffffffe64._M_n,in_stack_fffffffffffffe60));
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe64._M_n,in_stack_fffffffffffffe60));
        }
        std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe70)
        ;
        std::__cxx11::string::~string(local_30);
      }
    }
  }
  return;
}

Assistant:

void CLIntercept::reportMDAPICounters( std::ostream& os )
{
    if( config().DevicePerfCounterTiming &&
        config().DevicePerfCounterEventBasedSampling &&
        !m_MetricAggregations.empty() )
    {
        std::string header;
        std::vector<uint32_t> headerWidths;
        for( auto& metric : m_MetricAggregations.begin()->second )
        {
            const std::string& metricName = metric.first;

            header += metricName + ", ";
            headerWidths.push_back((uint32_t)metricName.length());
        }

        os << std::endl << "Device Performance Counter Timing: (Average metric per enqueue)" << std::endl;
        os << "                                FunctionName,  Calls, " << header;

        for( auto& metricsForKernel : m_MetricAggregations )
        {
            const std::string& kernelName = metricsForKernel.first;
            const MetricsDiscovery::CMetricAggregationsForKernel& kernelMetrics = metricsForKernel.second;

            uint64_t count = kernelMetrics.begin()->second.Count;
            os << std::endl << std::right << std::setw( 44 ) << kernelName << ", ";
            os << std::right << std::setw( 6 ) << count << ", ";

            int numMetric = 0;
            for( auto& metric : kernelMetrics )
            {
                const MetricsDiscovery::SMetricAggregationData& aggregationData = metric.second;
                os << std::right << std::setw( headerWidths[ numMetric++ ] );
                os << aggregationData.Sum / aggregationData.Count << ", ";
            }
        }

        os << std::endl;
    }
}